

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinary>
               (undefined8 stream,
               vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
               *arg)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_28;
  size_t i;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
  *arg_local;
  ostream *stream_local;
  
  for (local_28 = 0;
      sVar1 = std::
              vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
              ::size(arg), local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::
             vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
             ::operator[](arg,local_28);
    deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinary>
              (stream,pvVar2);
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}